

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

void __thiscall
duckdb::RowGroup::Update
          (RowGroup *this,TransactionData transaction,DataChunk *update_chunk,row_t *ids,
          idx_t offset,idx_t count,vector<duckdb::PhysicalIndex,_true> *column_ids)

{
  storage_t c;
  const_reference pvVar1;
  ColumnData *pCVar2;
  reference pvVar3;
  type other;
  ulong __n;
  Vector sliced_vector;
  Vector local_98;
  
  for (__n = 0; __n < (ulong)((long)(column_ids->
                                    super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                    ).
                                    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(column_ids->
                                    super_vector<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                    ).
                                    super__Vector_base<duckdb::PhysicalIndex,_std::allocator<duckdb::PhysicalIndex>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3); __n = __n + 1)
  {
    pvVar1 = vector<duckdb::PhysicalIndex,_true>::get<true>(column_ids,__n);
    c = pvVar1->index;
    pCVar2 = GetColumn(this,c);
    if (offset == 0) {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&update_chunk->data,__n);
      (*pCVar2->_vptr_ColumnData[0x17])
                (pCVar2,c,pvVar3,ids,count,pCVar2->_vptr_ColumnData,
                 transaction.transaction.ptr._0_4_,(undefined4)transaction.transaction_id,
                 transaction.start_time);
    }
    else {
      pvVar3 = vector<duckdb::Vector,_true>::get<true>(&update_chunk->data,__n);
      Vector::Vector(&local_98,pvVar3,offset,count + offset);
      Vector::Flatten(&local_98,count);
      (*pCVar2->_vptr_ColumnData[0x17])(pCVar2,c,&local_98,ids + offset,count);
      Vector::~Vector(&local_98);
    }
    (*pCVar2->_vptr_ColumnData[0x19])(&local_98,pCVar2);
    other = unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>::
            operator*((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true>
                       *)&local_98);
    MergeStatistics(this,c,other);
    ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    ~unique_ptr((unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
                &local_98);
  }
  return;
}

Assistant:

void RowGroup::Update(TransactionData transaction, DataChunk &update_chunk, row_t *ids, idx_t offset, idx_t count,
                      const vector<PhysicalIndex> &column_ids) {
#ifdef DEBUG
	for (size_t i = offset; i < offset + count; i++) {
		D_ASSERT(ids[i] >= row_t(this->start) && ids[i] < row_t(this->start + this->count));
	}
#endif
	for (idx_t i = 0; i < column_ids.size(); i++) {
		auto column = column_ids[i];
		D_ASSERT(column.index != COLUMN_IDENTIFIER_ROW_ID);
		auto &col_data = GetColumn(column.index);
		D_ASSERT(col_data.type.id() == update_chunk.data[i].GetType().id());
		if (offset > 0) {
			Vector sliced_vector(update_chunk.data[i], offset, offset + count);
			sliced_vector.Flatten(count);
			col_data.Update(transaction, column.index, sliced_vector, ids + offset, count);
		} else {
			col_data.Update(transaction, column.index, update_chunk.data[i], ids, count);
		}
		MergeStatistics(column.index, *col_data.GetUpdateStatistics());
	}
}